

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
::iterator::operator*(iterator *this)

{
  uint uVar1;
  int iVar2;
  ctrl_t *pcVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  reference extraout_RAX;
  undefined8 *in_RCX;
  code *extraout_RDX;
  SchedulingMode in_ESI;
  bool bVar5;
  
  pcVar3 = this->ctrl_;
  if (pcVar3 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
    ::iterator::operator*((iterator *)this);
LAB_001fb00f:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    in_RCX = (undefined8 *)(kEmptyGroup + 0x10);
    if (pcVar3 == kEmptyGroup + 0x10) goto LAB_001fb00f;
    if (kSentinel < *pcVar3) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
  ::iterator::operator*((iterator *)this);
  iVar2 = *(int *)&this->ctrl_;
  if (iVar2 < 0x5a308d2) {
    if ((iVar2 != 0) && (iVar2 != 0xdd)) {
LAB_001fb0a8:
      raw_log_internal::RawLog(kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx")
      ;
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/base/call_once.h"
                    ,0xa4,
                    "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = void (&)(std::pair<const google::protobuf::FileDescriptorTables *, const google::protobuf::SourceCodeInfo *> *), Args = <std::pair<const google::protobuf::FileDescriptorTables *, const google::protobuf::SourceCodeInfo *> *>]"
                   );
    }
  }
  else if ((iVar2 != 0x5a308d2) && (iVar2 != 0x65c2937b)) goto LAB_001fb0a8;
  LOCK();
  bVar5 = *(int *)&this->ctrl_ == 0;
  if (bVar5) {
    *(undefined4 *)&this->ctrl_ = 0x65c2937b;
  }
  UNLOCK();
  if (!bVar5) {
    uVar4 = base_internal::SpinLockWait
                      ((atomic<unsigned_int> *)this,3,
                       base_internal::
                       CallOnceImpl<void_(&)(std::pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>_*),_std::pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>_*>
                       ::trans,in_ESI);
    if (uVar4 != 0) {
      return (reference)CONCAT44(extraout_var,uVar4);
    }
  }
  (*extraout_RDX)(*in_RCX);
  LOCK();
  uVar1 = *(uint *)&this->ctrl_;
  *(undefined4 *)&this->ctrl_ = 0xdd;
  UNLOCK();
  if (uVar1 != 0x5a308d2) {
    return (reference)(ulong)uVar1;
  }
  AbslInternalSpinLockWake_lts_20250127((atomic<unsigned_int> *)this,true);
  return extraout_RAX;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }